

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Syndicated_C2_Request.cpp
# Opt level: O0

object get_reqID_c2_req(SRUP_MSG_SYNDICATED_C2_REQ *self)

{
  uint8_t *x;
  SRUP_MSG_SYNDICATED_C2_REQ *in_RSI;
  uint8_t *rv;
  SRUP_MSG_SYNDICATED_C2_REQ *self_local;
  
  x = SRUP_MSG_SYNDICATED_C2_REQ::req_ID(in_RSI);
  if (x == (uint8_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<unsigned_char>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_reqID_c2_req (SRUP_MSG_SYNDICATED_C2_REQ &self)
{
    const uint8_t* rv;
    rv = self.req_ID();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();
}